

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O0

PIPELINE_STATE_STATUS __thiscall
Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::GetStatus
          (PipelineStateBase<Diligent::EngineVkImplTraits> *this,bool WaitForCompletion)

{
  PIPELINE_STATE_STATUS PVar1;
  Char *pCVar2;
  char (*in_RCX) [55];
  undefined1 local_68 [8];
  string msg_1;
  ASYNC_TASK_STATUS InitTaskStatus;
  undefined1 local_38 [8];
  string msg;
  bool WaitForCompletion_local;
  PipelineStateBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._M_local_buf[0xf] = WaitForCompletion;
  PVar1 = std::atomic<Diligent::PIPELINE_STATE_STATUS>::load(&this->m_Status,memory_order_seq_cst);
  if (PVar1 == PIPELINE_STATE_STATUS_UNINITIALIZED) {
    FormatString<char[26],char[55]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_Status.load() != PIPELINE_STATE_STATUS_UNINITIALIZED",in_RCX);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"GetStatus",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x2fb);
    std::__cxx11::string::~string((string *)local_38);
  }
  msg_1.field_2._8_4_ =
       AsyncInitializer::Update(&this->m_AsyncInitializer,(bool)(msg.field_2._M_local_buf[0xf] & 1))
  ;
  if ((msg_1.field_2._8_4_ == ASYNC_TASK_STATUS_COMPLETE) &&
     (PVar1 = std::atomic<Diligent::PIPELINE_STATE_STATUS>::load
                        (&this->m_Status,memory_order_seq_cst), PVar1 < PIPELINE_STATE_STATUS_READY)
     ) {
    FormatString<char[91]>
              ((string *)local_68,
               (char (*) [91])
               "Pipeline state status must be atomically set by the initialization task before it finishes"
              );
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"GetStatus",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x2ff);
    std::__cxx11::string::~string((string *)local_68);
  }
  PVar1 = std::atomic<Diligent::PIPELINE_STATE_STATUS>::load(&this->m_Status,memory_order_seq_cst);
  return PVar1;
}

Assistant:

GetStatus(bool WaitForCompletion = false) override
    {
        VERIFY_EXPR(m_Status.load() != PIPELINE_STATE_STATUS_UNINITIALIZED);
        ASYNC_TASK_STATUS InitTaskStatus = AsyncInitializer::Update(m_AsyncInitializer, WaitForCompletion);
        if (InitTaskStatus == ASYNC_TASK_STATUS_COMPLETE)
        {
            VERIFY(m_Status.load() > PIPELINE_STATE_STATUS_COMPILING, "Pipeline state status must be atomically set by the initialization task before it finishes");
        }
        return m_Status.load();
    }